

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H22_radix_sort.c
# Opt level: O0

void sort(uint *A,uint *B,int n)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int aiStack_128 [2];
  int C [64];
  int local_20;
  int bit;
  int i;
  int n_local;
  uint *B_local;
  uint *A_local;
  
  for (C[0x3f] = 0; C[0x3f] < 0x20; C[0x3f] = C[0x3f] + 6) {
    for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
      aiStack_128[local_20] = 0;
    }
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      uVar2 = A[local_20] >> ((byte)C[0x3f] & 0x1f) & 0x3f;
      aiStack_128[uVar2] = aiStack_128[uVar2] + 1;
    }
    for (local_20 = 1; local_20 < 0x40; local_20 = local_20 + 1) {
      aiStack_128[local_20] = aiStack_128[local_20 + -1] + aiStack_128[local_20];
    }
    for (local_20 = n + -1; -1 < local_20; local_20 = local_20 + -1) {
      uVar2 = A[local_20];
      uVar3 = A[local_20] >> ((byte)C[0x3f] & 0x1f) & 0x3f;
      iVar1 = aiStack_128[uVar3];
      aiStack_128[uVar3] = iVar1 + -1;
      B[iVar1 + -1] = uVar2;
    }
    for (local_20 = 0; local_20 < n; local_20 = local_20 + 1) {
      A[local_20] = B[local_20];
    }
  }
  return;
}

Assistant:

void sort(unsigned int A[], unsigned int B[], int n) {
  int i, bit;
  int C[M];

  for (bit = 0; bit < 32; bit += 6) {
    for (i = 0; i < M; ++i) {
      C[i] = 0;
    }
    for (i = 0; i < n; ++i) {
      ++C[(A[i] >> bit) & MASK];
    }

    for (i = 1; i < M; ++i) {
      C[i] += C[i - 1];
    }

    for (i = n - 1; i >= 0; --i) {
      B[--C[(A[i] >> bit) & MASK]] = A[i];
    }

    for (i = 0; i < n; i++) {
      A[i] = B[i];
    }
  }
}